

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_connection.c
# Opt level: O0

int amqp_send_frame(amqp_connection_state_t state,amqp_frame_t *frame)

{
  byte bVar1;
  void *data;
  amqp_bytes_t encoded_00;
  uint uVar2;
  int iVar3;
  ssize_t sVar4;
  uint64_t uVar5;
  byte *in_RSI;
  amqp_connection_state_t in_RDI;
  uint64_t current_time;
  amqp_bytes_t encoded;
  size_t out_frame_len;
  amqp_bytes_t *body;
  uint8_t frame_end_byte;
  iovec iov [3];
  int res;
  void *out_frame;
  void *in_stack_00000130;
  amqp_method_number_t in_stack_0000013c;
  undefined1 in_stack_00000140 [16];
  iovec *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  size_t in_stack_ffffffffffffff78;
  void *in_stack_ffffffffffffff80;
  void *in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffff98;
  uint16_t class_id;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  void *in_stack_ffffffffffffffa8;
  int local_24;
  
  class_id = (uint16_t)((ulong)in_stack_ffffffffffffff98 >> 0x30);
  data = (in_RDI->outbound_buffer).bytes;
  amqp_e8((void *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
          (size_t)in_stack_ffffffffffffff68,'\0');
  amqp_e16((void *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
           (size_t)in_stack_ffffffffffffff68,0);
  if (*in_RSI == 3) {
    amqp_e32((void *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
             (size_t)in_stack_ffffffffffffff68,0);
    sVar4 = amqp_socket_writev((amqp_socket_t *)
                               CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                               in_stack_ffffffffffffff68,0);
    local_24 = (int)sVar4;
    goto LAB_001113b6;
  }
  bVar1 = *in_RSI;
  uVar2 = (uint)bVar1;
  if (uVar2 == 1) {
    amqp_e32((void *)(ulong)CONCAT14(bVar1,in_stack_ffffffffffffff70),
             (size_t)in_stack_ffffffffffffff68,0);
    amqp_offset(data,0xb);
    iVar3 = amqp_encode_method(in_stack_0000013c,in_stack_00000130,(amqp_bytes_t)in_stack_00000140);
joined_r0x0011124e:
    if (iVar3 < 0) {
      return iVar3;
    }
  }
  else {
    if (uVar2 == 2) {
      amqp_e16((void *)(ulong)CONCAT14(bVar1,in_stack_ffffffffffffff70),
               (size_t)in_stack_ffffffffffffff68,0);
      amqp_e16((void *)CONCAT44(uVar2,in_stack_ffffffffffffff70),(size_t)in_stack_ffffffffffffff68,0
              );
      amqp_e64(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
               CONCAT44(uVar2,in_stack_ffffffffffffff70));
      amqp_offset(data,0x13);
      encoded_00.len._7_1_ = in_stack_ffffffffffffffa7;
      encoded_00.len._0_7_ = in_stack_ffffffffffffffa0;
      encoded_00.bytes = in_stack_ffffffffffffffa8;
      iVar3 = amqp_encode_properties(class_id,in_stack_ffffffffffffff90,encoded_00);
      goto joined_r0x0011124e;
    }
    if (uVar2 != 8) {
      return -10;
    }
  }
  amqp_e32((void *)CONCAT44(uVar2,in_stack_ffffffffffffff70),(size_t)in_stack_ffffffffffffff68,0);
  amqp_e8((void *)CONCAT44(uVar2,in_stack_ffffffffffffff70),(size_t)in_stack_ffffffffffffff68,'\0');
  sVar4 = amqp_socket_send((amqp_socket_t *)CONCAT44(uVar2,in_stack_ffffffffffffff70),
                           in_stack_ffffffffffffff68,0x1113b2);
  local_24 = (int)sVar4;
LAB_001113b6:
  if (0 < in_RDI->heartbeat) {
    uVar5 = amqp_get_monotonic_timestamp();
    if (uVar5 == 0) {
      return -0xe;
    }
    uVar5 = amqp_calc_next_send_heartbeat(in_RDI,uVar5);
    in_RDI->next_send_heartbeat = uVar5;
  }
  return local_24;
}

Assistant:

int amqp_send_frame(amqp_connection_state_t state,
                    const amqp_frame_t *frame)
{
  void *out_frame = state->outbound_buffer.bytes;
  int res;

  amqp_e8(out_frame, 0, frame->frame_type);
  amqp_e16(out_frame, 1, frame->channel);

  if (frame->frame_type == AMQP_FRAME_BODY) {
    /* For a body frame, rather than copying data around, we use
       writev to compose the frame */
    struct iovec iov[3];
    uint8_t frame_end_byte = AMQP_FRAME_END;
    const amqp_bytes_t *body = &frame->payload.body_fragment;

    amqp_e32(out_frame, 3, body->len);

    iov[0].iov_base = out_frame;
    iov[0].iov_len = HEADER_SIZE;
    iov[1].iov_base = body->bytes;
    iov[1].iov_len = body->len;
    iov[2].iov_base = &frame_end_byte;
    iov[2].iov_len = FOOTER_SIZE;

    res = amqp_socket_writev(state->socket, iov, 3);
  } else {
    size_t out_frame_len;
    amqp_bytes_t encoded;

    switch (frame->frame_type) {
    case AMQP_FRAME_METHOD:
      amqp_e32(out_frame, HEADER_SIZE, frame->payload.method.id);

      encoded.bytes = amqp_offset(out_frame, HEADER_SIZE + 4);
      encoded.len = state->outbound_buffer.len - HEADER_SIZE - 4 - FOOTER_SIZE;

      res = amqp_encode_method(frame->payload.method.id,
                               frame->payload.method.decoded, encoded);
      if (res < 0) {
        return res;
      }

      out_frame_len = res + 4;
      break;

    case AMQP_FRAME_HEADER:
      amqp_e16(out_frame, HEADER_SIZE, frame->payload.properties.class_id);
      amqp_e16(out_frame, HEADER_SIZE+2, 0); /* "weight" */
      amqp_e64(out_frame, HEADER_SIZE+4, frame->payload.properties.body_size);

      encoded.bytes = amqp_offset(out_frame, HEADER_SIZE + 12);
      encoded.len = state->outbound_buffer.len - HEADER_SIZE - 12 - FOOTER_SIZE;

      res = amqp_encode_properties(frame->payload.properties.class_id,
                                   frame->payload.properties.decoded, encoded);
      if (res < 0) {
        return res;
      }

      out_frame_len = res + 12;
      break;

    case AMQP_FRAME_HEARTBEAT:
      out_frame_len = 0;
      break;

    default:
      return AMQP_STATUS_INVALID_PARAMETER;
    }

    amqp_e32(out_frame, 3, out_frame_len);
    amqp_e8(out_frame, out_frame_len + HEADER_SIZE, AMQP_FRAME_END);
    res = amqp_socket_send(state->socket, out_frame,
                           out_frame_len + HEADER_SIZE + FOOTER_SIZE);
  }

  if (state->heartbeat > 0) {
    uint64_t current_time = amqp_get_monotonic_timestamp();
    if (0 == current_time) {
      return AMQP_STATUS_TIMER_FAILURE;
    }
    state->next_send_heartbeat = amqp_calc_next_send_heartbeat(state, current_time);
  }

  return res;
}